

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

sunrealtype N_VWSqrSumMaskLocal_Serial(N_Vector x,N_Vector w,N_Vector id)

{
  long lVar1;
  long lVar2;
  sunrealtype sVar3;
  double dVar4;
  
  lVar1 = *x->content;
  if (0 < lVar1) {
    lVar2 = 0;
    sVar3 = 0.0;
    do {
      if (0.0 < *(double *)(*(long *)((long)id->content + 0x10) + lVar2 * 8)) {
        dVar4 = *(double *)(*(long *)((long)x->content + 0x10) + lVar2 * 8) *
                *(double *)(*(long *)((long)w->content + 0x10) + lVar2 * 8);
        sVar3 = sVar3 + dVar4 * dVar4;
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
    return sVar3;
  }
  return 0.0;
}

Assistant:

sunrealtype N_VWSqrSumMaskLocal_Serial(N_Vector x, N_Vector w, N_Vector id)
{
  sunindextype i, N;
  sunrealtype sum, prodi, *xd, *wd, *idd;

  sum = ZERO;
  xd = wd = idd = NULL;

  N   = NV_LENGTH_S(x);
  xd  = NV_DATA_S(x);
  wd  = NV_DATA_S(w);
  idd = NV_DATA_S(id);

  for (i = 0; i < N; i++)
  {
    if (idd[i] > ZERO)
    {
      prodi = xd[i] * wd[i];
      sum += SUNSQR(prodi);
    }
  }

  return (sum);
}